

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::unload_rle_data(TGAImage *this,ofstream *out)

{
  value_type vVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  const_reference pvVar5;
  ulong uVar6;
  uchar *puVar7;
  bool bVar8;
  bool bVar9;
  ulong local_58;
  size_t t;
  bool succ_eq;
  bool raw;
  long lStack_48;
  uint8_t run_length;
  size_t curbyte;
  size_t chunkstart;
  size_t curpix;
  size_t n_pixels;
  uint8_t max_chunk_length;
  ofstream *out_local;
  TGAImage *this_local;
  
  uVar3 = (ulong)(this->width * this->height);
  chunkstart = 0;
  do {
    if (uVar3 <= chunkstart) {
      return true;
    }
    lVar4 = chunkstart * this->bytespp;
    lStack_48 = chunkstart * this->bytespp;
    bVar2 = true;
    for (t._7_1_ = 1; chunkstart + t._7_1_ < uVar3 && t._7_1_ < 0x80; t._7_1_ = t._7_1_ + 1) {
      bVar9 = true;
      local_58 = 0;
      while( true ) {
        bVar8 = false;
        if (bVar9) {
          bVar8 = local_58 < this->bytespp;
        }
        if (!bVar8) break;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->data,lStack_48 + local_58);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->data,lStack_48 + local_58 + (ulong)this->bytespp);
        bVar9 = vVar1 == *pvVar5;
        local_58 = local_58 + 1;
      }
      lStack_48 = (ulong)this->bytespp + lStack_48;
      if (t._7_1_ == 1) {
        bVar2 = (bool)(bVar9 ^ 1);
      }
      if ((bVar2) && (bVar9)) {
        t._7_1_ = t._7_1_ - 1;
        break;
      }
      if ((!bVar2) && (!bVar9)) break;
    }
    chunkstart = t._7_1_ + chunkstart;
    std::ostream::put((char)out);
    uVar6 = std::ios::good();
    if ((uVar6 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
      return false;
    }
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
    std::ostream::write((char *)out,(long)(puVar7 + lVar4));
    uVar6 = std::ios::good();
    if ((uVar6 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
      return false;
    }
  } while( true );
}

Assistant:

bool TGAImage::unload_rle_data(std::ofstream &out) const
{
    const std::uint8_t max_chunk_length = 128;
    size_t n_pixels = width * height;
    size_t curpix = 0;
    while (curpix < n_pixels) {
        size_t chunkstart = curpix * bytespp;
        size_t curbyte = curpix * bytespp;
        std::uint8_t run_length = 1;
        bool raw = true;
        while (curpix + run_length < n_pixels && run_length < max_chunk_length) {
            bool succ_eq = true;
            for (size_t t = 0; succ_eq && t < bytespp; t++)
                succ_eq = (data[curbyte + t] == data[curbyte + t + bytespp]);
            curbyte += bytespp;
            if (1 == run_length) raw = !succ_eq;
            if (raw && succ_eq) {
                run_length--;
                break;
            }
            if (!raw && !succ_eq) break;
            run_length++;
        }
        curpix += run_length;
        out.put(raw ? run_length - 1 : run_length + 127);
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
        out.write(reinterpret_cast<const char *>(data.data() + chunkstart),
                  (raw ? run_length * bytespp : bytespp));
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
    }
    return true;
}